

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O3

void __thiscall
crypto_tests::CryptoTest::TestChaCha20
          (CryptoTest *this,string *hex_message,string *hexkey,Nonce96 nonce,uint32_t seek,
          string *hexout)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer pbVar6;
  pointer pbVar7;
  uint uVar8;
  long lVar9;
  uint64_t maxval;
  pointer pbVar10;
  pointer pbVar11;
  undefined4 in_register_0000008c;
  iterator pvVar12;
  FastRandomContext *this_00;
  int j;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_std::byte> key_00;
  Nonce96 nonce_00;
  Span<const_std::byte> input;
  Span<std::byte> out;
  const_string file;
  Span<const_unsigned_char> s;
  Nonce96 nonce_01;
  Span<std::byte> out_00;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  Nonce96 nonce_02;
  Span<const_std::byte> input_00;
  Span<std::byte> out_01;
  const_string file_01;
  Span<const_unsigned_char> s_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  Span<std::byte> output;
  Span<std::byte> output_00;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  lazy_ostream local_1e8;
  undefined1 *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  vector<std::byte,_std::allocator<std::byte>_> outres;
  vector<std::byte,_std::allocator<std::byte>_> m;
  vector<std::byte,_std::allocator<std::byte>_> key;
  string *local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined1 *local_148;
  string **local_140;
  string *local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined1 *local_120;
  string **local_118;
  string *local_110;
  char *local_108;
  assertion_result local_100;
  vector<std::byte,_std::allocator<std::byte>_> only_keystream;
  string local_d0;
  ChaCha20 rng;
  
  pvVar12 = (iterator)CONCAT44(in_register_0000008c,seek);
  pbVar11 = (pointer)nonce.second;
  uVar8 = nonce.first;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  output.m_size = pbVar11;
  ParseHex<std::byte>(&key,hex_str);
  if ((long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("key.size() == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                  ,0x8d,
                  "void crypto_tests::CryptoTest::TestChaCha20(const std::string &, const std::string &, ChaCha20::Nonce96, uint32_t, const std::string &)"
                 );
  }
  hex_str_00._M_str = (hex_message->_M_dataplus)._M_p;
  hex_str_00._M_len = hex_message->_M_string_length;
  ParseHex<std::byte>(&m,hex_str_00);
  key_00.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_00.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  ChaCha20Aligned::ChaCha20Aligned(&rng.m_aligned,key_00);
  rng.m_bufleft = 0;
  nonce_00._4_4_ = 0;
  nonce_00.first = uVar8;
  nonce_00.second = (unsigned_long)pbVar11;
  ChaCha20Aligned::Seek(&rng.m_aligned,nonce_00,seek);
  rng.m_bufleft = 0;
  outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize(&outres,hexout->_M_string_length >> 1);
  if (hex_message->_M_string_length == 0) {
    out.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
    out.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
    ChaCha20::Keystream(&rng,out);
  }
  else {
    input.m_size = (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_start;
    if (input.m_size * 2 != hexout->_M_string_length) {
      __assert_fail("hex_message.empty() || m.size() * 2 == hexout.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                    ,0x93,
                    "void crypto_tests::CryptoTest::TestChaCha20(const std::string &, const std::string &, ChaCha20::Nonce96, uint32_t, const std::string &)"
                   );
    }
    output.m_size =
         outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    input.m_data = m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    output.m_data =
         outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    ChaCha20::Crypt(&rng,input,output);
  }
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x9b;
  file.m_begin = (iterator)&local_1b8;
  msg.m_end = pvVar12;
  msg.m_begin = (iterator)output.m_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c8,msg);
  local_1e8.m_empty = false;
  local_1e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_1d8 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = "";
  s.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_d0,s);
  sVar2 = hexout->_M_string_length;
  if (sVar2 == local_d0._M_string_length) {
    if (sVar2 == 0) {
      local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar3 = bcmp((hexout->_M_dataplus)._M_p,local_d0._M_dataplus._M_p,sVar2);
      local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar3 == 0);
    }
  }
  else {
    local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_776098;
  only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xe4cf45;
  local_118 = &local_110;
  local_110 = hexout;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_01388fc8;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_138;
  local_138 = &local_d0;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_01388fc8;
  local_148 = boost::unit_test::lazy_ostream::inst;
  output.m_size = (pointer)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_1e8,1,2,REQUIRE,0xe5c3ff,(size_t)&only_keystream,0x9b,&local_130,
             "HexStr(outres)",&local_158);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (hex_message->_M_string_length != 0) {
    nonce_01._4_4_ = 0;
    nonce_01.first = uVar8;
    nonce_01.second = (unsigned_long)pbVar11;
    ChaCha20Aligned::Seek(&rng.m_aligned,nonce_01,seek);
    rng.m_bufleft = 0;
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&only_keystream,
               (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,(allocator_type *)&local_130);
    out_00.m_size =
         (long)only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    out_00.m_data =
         only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    ChaCha20::Keystream(&rng,out_00);
    if (m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar9 = 0;
      do {
        outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] =
             only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9] ^
             m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start);
    }
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xa4;
    file_00.m_begin = (iterator)&local_1f8;
    msg_00.m_end = pvVar12;
    msg_00.m_begin = (iterator)output.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
               msg_00);
    local_1e8.m_empty = false;
    local_1e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_1d0 = "";
    s_00.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_00.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_d0,s_00);
    sVar2 = hexout->_M_string_length;
    if (sVar2 == local_d0._M_string_length) {
      if (sVar2 == 0) {
        local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x1;
      }
      else {
        iVar3 = bcmp((hexout->_M_dataplus)._M_p,local_d0._M_dataplus._M_p,sVar2);
        local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(iVar3 == 0);
      }
    }
    else {
      local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
    }
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = (string *)0xe4cee0;
    local_108 = "";
    local_138 = hexout;
    local_128 = 0;
    local_130 = &PTR__lazy_ostream_01388fc8;
    local_120 = boost::unit_test::lazy_ostream::inst;
    local_118 = &local_138;
    local_140 = &local_160;
    local_150 = 0;
    local_158 = &PTR__lazy_ostream_01388fc8;
    local_148 = boost::unit_test::lazy_ostream::inst;
    output.m_size = (pointer)0x1;
    pvVar12 = (iterator)0x2;
    local_160 = &local_d0;
    boost::test_tools::tt_detail::report_assertion
              (&local_100,&local_1e8,1,2,REQUIRE,0xe5c3ff,(size_t)&local_110,0xa4,
               (allocator_type *)&local_130,"HexStr(outres)",&local_158);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  iVar3 = 0;
  do {
    pbVar10 = (pointer)(hexout->_M_string_length >> 1);
    if (pbVar10 == (pointer)0x0) {
      uVar4 = 0x40;
    }
    else {
      lVar9 = 0x3f;
      if (pbVar10 != (pointer)0x0) {
        for (; (ulong)pbVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      uVar4 = (uint)lVar9 ^ 0x3f;
    }
    do {
      pbVar6 = (pointer)RandomMixin<FastRandomContext>::randbits
                                  (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar4);
    } while (pbVar10 < pbVar6);
    pbVar10 = (pointer)((hexout->_M_string_length >> 1) - (long)pbVar6);
    if (pbVar10 == (pointer)0x0) {
      uVar4 = 0x40;
    }
    else {
      lVar9 = 0x3f;
      if (pbVar10 != (pointer)0x0) {
        for (; (ulong)pbVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      uVar4 = (uint)lVar9 ^ 0x3f;
    }
    only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = pbVar6;
    do {
      pbVar7 = (pointer)RandomMixin<FastRandomContext>::randbits
                                  (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar4);
    } while (pbVar10 < pbVar7);
    only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((hexout->_M_string_length >> 1) - (long)(pbVar6 + (long)pbVar7));
    nonce_02._4_4_ = 0;
    nonce_02.first = uVar8;
    nonce_02.second = (unsigned_long)pbVar11;
    only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar7;
    ChaCha20Aligned::Seek(&rng.m_aligned,nonce_02,seek);
    rng.m_bufleft = 0;
    local_130 = (undefined **)((ulong)local_130 & 0xffffffffffffff00);
    std::vector<std::byte,_std::allocator<std::byte>_>::_M_fill_assign
              (&outres,hexout->_M_string_length >> 1,(value_type *)&local_130);
    lVar9 = 0;
    pbVar10 = (pointer)0x0;
    do {
      pbVar6 = (&only_keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start)[lVar9];
      if (hex_message->_M_string_length == 0) {
        out_01.m_data =
             outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pbVar10;
        out_01.m_size = (size_t)pbVar6;
        ChaCha20::Keystream(&rng,out_01);
      }
      else {
        input_00.m_data =
             m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pbVar10;
        output_00.m_data =
             outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pbVar10;
        input_00.m_size = (size_t)pbVar6;
        output_00.m_size = (size_t)pbVar6;
        output.m_size = pbVar6;
        ChaCha20::Crypt(&rng,input_00,output_00);
      }
      pbVar10 = pbVar10 + (long)pbVar6;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    local_218 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_210 = "";
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xb9;
    file_01.m_begin = (iterator)&local_218;
    msg_01.m_end = pvVar12;
    msg_01.m_begin = (iterator)output.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_228,
               msg_01);
    local_1e8.m_empty = false;
    local_1e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_1d8 = boost::unit_test::lazy_ostream::inst;
    local_1d0 = "";
    s_01.m_size = (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_01.m_data = outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_d0,s_01);
    sVar2 = hexout->_M_string_length;
    if (sVar2 == local_d0._M_string_length) {
      if (sVar2 == 0) {
        local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x1;
      }
      else {
        iVar5 = bcmp((hexout->_M_dataplus)._M_p,local_d0._M_dataplus._M_p,sVar2);
        local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(iVar5 == 0);
      }
    }
    else {
      local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
    }
    local_100.m_message.px = (element_type *)0x0;
    local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_110 = (string *)0xe4cee0;
    local_108 = "";
    local_138 = hexout;
    local_128 = 0;
    local_130 = &PTR__lazy_ostream_01388fc8;
    local_120 = boost::unit_test::lazy_ostream::inst;
    local_118 = &local_138;
    local_160 = &local_d0;
    local_150 = 0;
    local_158 = &PTR__lazy_ostream_01388fc8;
    local_148 = boost::unit_test::lazy_ostream::inst;
    local_140 = &local_160;
    output.m_size = (pointer)0x1;
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_100,&local_1e8,1,2,REQUIRE,0xe5c3ff,(size_t)&local_110,0xb9,&local_130,
               "HexStr(outres)",&local_158);
    boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  if (outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)outres.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ChaCha20::~ChaCha20(&rng);
  if (m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)m.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestChaCha20(const std::string &hex_message, const std::string &hexkey, ChaCha20::Nonce96 nonce, uint32_t seek, const std::string& hexout)
{
    auto key = ParseHex<std::byte>(hexkey);
    assert(key.size() == 32);
    auto m = ParseHex<std::byte>(hex_message);
    ChaCha20 rng{key};
    rng.Seek(nonce, seek);
    std::vector<std::byte> outres;
    outres.resize(hexout.size() / 2);
    assert(hex_message.empty() || m.size() * 2 == hexout.size());

    // perform the ChaCha20 round(s), if message is provided it will output the encrypted ciphertext otherwise the keystream
    if (!hex_message.empty()) {
        rng.Crypt(m, outres);
    } else {
        rng.Keystream(outres);
    }
    BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    if (!hex_message.empty()) {
        // Manually XOR with the keystream and compare the output
        rng.Seek(nonce, seek);
        std::vector<std::byte> only_keystream(outres.size());
        rng.Keystream(only_keystream);
        for (size_t i = 0; i != m.size(); i++) {
            outres[i] = m[i] ^ only_keystream[i];
        }
        BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    }

    // Repeat 10x, but fragmented into 3 chunks, to exercise the ChaCha20 class's caching.
    for (int i = 0; i < 10; ++i) {
        size_t lens[3];
        lens[0] = m_rng.randrange(hexout.size() / 2U + 1U);
        lens[1] = m_rng.randrange(hexout.size() / 2U + 1U - lens[0]);
        lens[2] = hexout.size() / 2U - lens[0] - lens[1];

        rng.Seek(nonce, seek);
        outres.assign(hexout.size() / 2U, {});
        size_t pos = 0;
        for (int j = 0; j < 3; ++j) {
            if (!hex_message.empty()) {
                rng.Crypt(Span{m}.subspan(pos, lens[j]), Span{outres}.subspan(pos, lens[j]));
            } else {
                rng.Keystream(Span{outres}.subspan(pos, lens[j]));
            }
            pos += lens[j];
        }
        BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    }
}